

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hardwarex.cpp
# Opt level: O0

int StartThreadPololux(POLOLU *pPololu)

{
  int iVar1;
  int local_1c;
  int id;
  POLOLU *pPololu_local;
  
  local_1c = 0;
  do {
    if ((POLOLU *)addrsPololu[local_1c] == pPololu) {
      resPololu[local_1c] = 1;
      bExitPololu[local_1c] = 0;
      InitCriticalSection(PololuCS + local_1c);
      iVar1 = CreateDefaultThread(PololuThread,pPololu,PololuThreadId + local_1c);
      return iVar1;
    }
    local_1c = local_1c + 1;
  } while (local_1c < 0x10);
  return 1;
}

Assistant:

HARDWAREX_API int StartThreadPololux(POLOLU* pPololu)
{
	int id = 0;

	while (addrsPololu[id] != pPololu)
	{
		id++;
		if (id >= MAX_NB_DEVICES_HARDWAREX) return EXIT_FAILURE;
	}

	resPololu[id] = EXIT_FAILURE;
	bExitPololu[id] = FALSE;
	InitCriticalSection(&PololuCS[id]);
	return CreateDefaultThread(PololuThread, (void*)pPololu, &PololuThreadId[id]);
}